

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O0

void __thiscall
HttpdBufferedReader_GetcThenEOF_Test::~HttpdBufferedReader_GetcThenEOF_Test
          (HttpdBufferedReader_GetcThenEOF_Test *this)

{
  HttpdBufferedReader_GetcThenEOF_Test *this_local;
  
  ~HttpdBufferedReader_GetcThenEOF_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, GetcThenEOF) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("a")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        getc_result_type const c1 = br.getc (io);
        ASSERT_TRUE (static_cast<bool> (c1));
        io = std::get<0> (*c1);
        maybe<char> const char1 = std::get<1> (*c1);
        ASSERT_TRUE (char1.has_value ());
        EXPECT_EQ (char1.value (), 'a');
    }
    {
        getc_result_type const c2 = br.getc (io);
        ASSERT_TRUE (static_cast<bool> (c2));
        // Uncomment the next line if adding further blocks to this test!
        // io = std::get<0> (*c2);
        maybe<char> const char2 = std::get<1> (*c2);
        ASSERT_FALSE (char2.has_value ());
    }
}